

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_posfix(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2,int line)

{
  undefined4 uVar1;
  int iVar2;
  int line_local;
  expdesc *e2_local;
  expdesc *e1_local;
  BinOpr opr_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e2);
  if ((0xb < (int)opr) || (iVar2 = constfolding(fs,opr,e1,e2), iVar2 == 0)) {
    e1_local._4_4_ = opr;
    switch(opr) {
    case OPR_ADD:
    case OPR_MUL:
      codecommutative(fs,opr,e1,e2,line);
      break;
    case OPR_SUB:
      iVar2 = finishbinexpneg(fs,e1,e2,OP_ADDI,line,TM_SUB);
      if (iVar2 != 0) {
        return;
      }
    case OPR_MOD:
    case OPR_POW:
    case OPR_DIV:
    case OPR_IDIV:
      codearith(fs,opr,e1,e2,0,line);
      break;
    case OPR_BAND:
    case OPR_BOR:
    case OPR_BXOR:
      codebitwise(fs,opr,e1,e2,line);
      break;
    case OPR_SHL:
      iVar2 = isSCint(e1);
      if (iVar2 == 0) {
        iVar2 = finishbinexpneg(fs,e1,e2,OP_SHRI,line,TM_SHL);
        if (iVar2 == 0) {
          codebinexpval(fs,opr,e1,e2,line);
        }
      }
      else {
        swapexps(e1,e2);
        codebini(fs,OP_SHLI,e1,e2,1,line,TM_SHL);
      }
      break;
    case OPR_SHR:
      iVar2 = isSCint(e2);
      if (iVar2 == 0) {
        codebinexpval(fs,opr,e1,e2,line);
      }
      else {
        codebini(fs,OP_SHRI,e1,e2,0,line,TM_SHR);
      }
      break;
    case OPR_CONCAT:
      luaK_exp2nextreg(fs,e2);
      codeconcat(fs,e1,e2,line);
      break;
    case OPR_EQ:
    case OPR_NE:
      codeeq(fs,opr,e1,e2);
      break;
    case OPR_GT:
    case OPR_GE:
      swapexps(e1,e2);
      e1_local._4_4_ = opr - OPR_MOD;
    case OPR_LT:
    case OPR_LE:
      codeorder(fs,e1_local._4_4_,e1,e2);
      break;
    case OPR_AND:
      luaK_concat(fs,&e2->f,e1->f);
      uVar1 = *(undefined4 *)&e2->field_0x4;
      e1->k = e2->k;
      *(undefined4 *)&e1->field_0x4 = uVar1;
      e1->u = e2->u;
      iVar2 = e2->f;
      e1->t = e2->t;
      e1->f = iVar2;
      break;
    case OPR_OR:
      luaK_concat(fs,&e2->t,e1->t);
      uVar1 = *(undefined4 *)&e2->field_0x4;
      e1->k = e2->k;
      *(undefined4 *)&e1->field_0x4 = uVar1;
      e1->u = e2->u;
      iVar2 = e2->f;
      e1->t = e2->t;
      e1->f = iVar2;
    }
  }
  return;
}

Assistant:

void luaK_posfix (FuncState *fs, BinOpr opr,
                  expdesc *e1, expdesc *e2, int line) {
  luaK_dischargevars(fs, e2);
  if (foldbinop(opr) && constfolding(fs, opr + LUA_OPADD, e1, e2))
    return;  /* done by folding */
  switch (opr) {
    case OPR_AND: {
      lua_assert(e1->t == NO_JUMP);  /* list closed by 'luaK_infix' */
      luaK_concat(fs, &e2->f, e1->f);
      *e1 = *e2;
      break;
    }
    case OPR_OR: {
      lua_assert(e1->f == NO_JUMP);  /* list closed by 'luaK_infix' */
      luaK_concat(fs, &e2->t, e1->t);
      *e1 = *e2;
      break;
    }
    case OPR_CONCAT: {  /* e1 .. e2 */
      luaK_exp2nextreg(fs, e2);
      codeconcat(fs, e1, e2, line);
      break;
    }
    case OPR_ADD: case OPR_MUL: {
      codecommutative(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SUB: {
      if (finishbinexpneg(fs, e1, e2, OP_ADDI, line, TM_SUB))
        break; /* coded as (r1 + -I) */
      /* ELSE */
    }  /* FALLTHROUGH */
    case OPR_DIV: case OPR_IDIV: case OPR_MOD: case OPR_POW: {
      codearith(fs, opr, e1, e2, 0, line);
      break;
    }
    case OPR_BAND: case OPR_BOR: case OPR_BXOR: {
      codebitwise(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SHL: {
      if (isSCint(e1)) {
        swapexps(e1, e2);
        codebini(fs, OP_SHLI, e1, e2, 1, line, TM_SHL);  /* I << r2 */
      }
      else if (finishbinexpneg(fs, e1, e2, OP_SHRI, line, TM_SHL)) {
        /* coded as (r1 >> -I) */;
      }
      else  /* regular case (two registers) */
       codebinexpval(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SHR: {
      if (isSCint(e2))
        codebini(fs, OP_SHRI, e1, e2, 0, line, TM_SHR);  /* r1 >> I */
      else  /* regular case (two registers) */
        codebinexpval(fs, opr, e1, e2, line);
      break;
    }
    case OPR_EQ: case OPR_NE: {
      codeeq(fs, opr, e1, e2);
      break;
    }
    case OPR_GT: case OPR_GE: {
      /* '(a > b)' <=> '(b < a)';  '(a >= b)' <=> '(b <= a)' */
      swapexps(e1, e2);
      opr = cast(BinOpr, (opr - OPR_GT) + OPR_LT);
    }  /* FALLTHROUGH */
    case OPR_LT: case OPR_LE: {
      codeorder(fs, opr, e1, e2);
      break;
    }
    default: lua_assert(0);
  }
}